

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_server.cc
# Opt level: O2

ssl_hs_wait_t bssl::tls13_server_handshake(SSL_HANDSHAKE *hs)

{
  Array<unsigned_char> *pAVar1;
  UniquePtr<SSL_SESSION> *this;
  UniquePtr<SSL_CREDENTIAL> *this_00;
  SSLTranscript *this_01;
  InplaceVector<unsigned_char,_64UL> *this_02;
  UniquePtr<spake2plus::Verifier> *this_03;
  int iVar2;
  SSLCredentialType SVar3;
  ssl_credential_st *psVar4;
  SSL_HANDSHAKE_HINTS *pSVar5;
  SSL *pSVar6;
  SSL_CREDENTIAL *cred;
  ssl_session_st *psVar7;
  _func_int_SSL_CLIENT_HELLO_ptr *p_Var8;
  SSLPAKEShare *pSVar9;
  _func_bool_SSL_ptr_Array<unsigned_char> *p_Var10;
  size_t len;
  Span<const_unsigned_char> lhs;
  Span<const_unsigned_char> rhs;
  Span<const_unsigned_char> lhs_00;
  Span<const_unsigned_char> rhs_00;
  Span<const_unsigned_char> context;
  Span<const_unsigned_char> id_prover;
  Span<const_unsigned_char> lhs_01;
  Span<const_unsigned_char> lhs_02;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  Span<const_unsigned_char> traffic_secret;
  Span<const_unsigned_char> traffic_secret_00;
  Span<const_unsigned_char> payload;
  Span<const_unsigned_char> traffic_secret_01;
  Span<const_unsigned_char> traffic_secret_02;
  Span<const_unsigned_char> traffic_secret_03;
  Span<const_unsigned_char> traffic_secret_04;
  Span<const_unsigned_char> msg_00;
  Span<const_unsigned_char> msg_01;
  Span<const_unsigned_char> in_01;
  Span<const_unsigned_char> ticket;
  Span<const_unsigned_char> in_02;
  Span<const_unsigned_char> id_verifier;
  Span<const_unsigned_char> w0;
  Span<const_unsigned_char> registration_record;
  Span<const_unsigned_char> prover_share;
  ssl_credential_st **ppsVar14;
  UniquePtr<SSL_SESSION> __p_00;
  bool bVar15;
  uint16_t uVar17;
  ssl_verify_result_t sVar20;
  uint uVar24;
  pointer __p_1;
  bool bVar16;
  undefined2 uVar18;
  uint16_t uVar19;
  int iVar21;
  ssl_ticket_aead_result_t sVar22;
  ssl_private_key_result_t sVar23;
  size_t sVar25;
  EVP_HPKE_KDF *kdf;
  EVP_HPKE_AEAD *aead;
  SSL3_STATE *pSVar26;
  uchar *puVar27;
  unsigned_short *puVar28;
  SSL_CIPHER *pSVar29;
  ulong uVar30;
  Verifier *pVVar31;
  EVP_MD *md;
  undefined4 extraout_var;
  undefined1 uVar32;
  ssl_hs_wait_t sVar33;
  uint *puVar34;
  SSL_CONFIG *pSVar35;
  uint16_t *puVar36;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ssl_hs_wait_t sVar37;
  ssl_hs_wait_t sVar38;
  undefined1 *puVar39;
  SSL *pSVar40;
  int iVar41;
  SSL_CLIENT_HELLO *in_R9;
  SSL_CLIENT_HELLO *client_hello_00;
  long lVar42;
  byte bVar43;
  pointer __p;
  uint8_t *puVar44;
  long lVar45;
  Array<unsigned_char> AVar46;
  Span<const_unsigned_char> in_03;
  Span<const_unsigned_char> in_04;
  Span<const_unsigned_char> in_05;
  Span<const_unsigned_char> in_06;
  CBS cipher_suites;
  Span<const_unsigned_char> psk;
  Array<unsigned_char> AVar47;
  OPENSSL_timeval OVar48;
  Span<unsigned_char> SVar49;
  Span<unsigned_char> SVar50;
  Span<const_unsigned_char> client_random;
  Span<unsigned_char> out_confirm;
  Span<const_unsigned_char> client_random_00;
  Span<const_unsigned_char> in_07;
  Span<const_unsigned_char> in_08;
  ssl_hs_wait_t sStackY_330;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 in_stack_fffffffffffffcdc;
  CBB *contents;
  CBB *pCVar53;
  CBB *in_stack_fffffffffffffce0;
  Span<unsigned_char> random;
  Array<unsigned_char> server_hello;
  bool unused;
  Array<ssl_credential_st_*> creds;
  CBB extensions;
  SSLMessage msg;
  uint16_t sigalg;
  undefined6 uStack_1d6;
  CBB *pCStack_1d0;
  uint16_t aead_id;
  size_t sStack_1a0;
  Array<unsigned_char> *local_178;
  InplaceVector<unsigned_char,_32UL> *local_170;
  CBB sigalg_contents;
  uint8_t alert;
  undefined7 uStack_127;
  size_t sStack_120;
  SSL_CLIENT_HELLO client_hello;
  CBB sigalgs_cbb;
  
  contents = (CBB *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
  this = &hs->new_session;
  this_00 = &hs->credential;
  this_01 = &hs->transcript;
  this_02 = &hs->expected_client_finished;
  local_170 = &hs->session_id;
  this_03 = &hs->pake_verifier;
  local_178 = &hs->ech_client_hello_buf;
  do {
    iVar2 = hs->tls13_state;
    puVar34 = &switchD_00239cb9::switchdataD_0030ed00;
    sVar37 = ssl_hs_error;
    switch(iVar2) {
    case 0:
      pSVar40 = hs->ssl;
      bVar15 = SSL_HANDSHAKE::GetClientHello(hs,&msg,&client_hello);
      sVar37 = ssl_hs_error;
      if (bVar15) {
        iVar21 = SSL_is_quic(pSVar40);
        if ((iVar21 == 0) || (client_hello.session_id_len == 0)) {
          iVar21 = SSL_is_dtls(pSVar40);
          if (iVar21 == 0) {
            in_02.size_ = client_hello.session_id_len;
            in_02.data_ = client_hello.session_id;
            InplaceVector<unsigned_char,_32UL>::CopyFrom(local_170,in_02);
          }
          creds.data_ = (ssl_credential_st **)0x0;
          creds.size_ = 0;
          bVar15 = ssl_get_full_credential_list(hs,&creds);
          ppsVar14 = creds.data_;
          sVar37 = ssl_hs_error;
          if (!bVar15) goto LAB_0023b508;
          if (creds.size_ == 0) {
            ERR_put_error(0x10,0,0xae,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                          ,0x14e);
            iVar21 = 0x50;
LAB_0023b438:
            ssl_send_alert(pSVar40,2,iVar21);
          }
          else {
            lVar45 = creds.size_ << 3;
            for (lVar42 = 0; lVar45 != lVar42; lVar42 = lVar42 + 8) {
              cred = *(SSL_CREDENTIAL **)((long)ppsVar14 + lVar42);
              ERR_clear_error();
              SVar3 = cred->type;
              if (SVar3 == kSPAKE2PlusV1Server) {
                pSVar9 = (hs->pake_share)._M_t.
                         super___uniq_ptr_impl<bssl::SSLPAKEShare,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_bssl::SSLPAKEShare_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_bssl::SSLPAKEShare_*,_false>._M_head_impl;
                if ((((pSVar9 != (SSLPAKEShare *)0x0) && (pSVar9->named_pake == 0x7d96)) &&
                    (lhs.data_ = (pSVar9->client_identity).data_,
                    lhs.size_ = (pSVar9->client_identity).size_,
                    rhs.data_ = (cred->client_identity).data_,
                    rhs.size_ = (cred->client_identity).size_,
                    bVar15 = internal::operator!=(lhs,rhs), !bVar15)) &&
                   (pSVar9 = (hs->pake_share)._M_t.
                             super___uniq_ptr_impl<bssl::SSLPAKEShare,_bssl::internal::Deleter>._M_t
                             .super__Tuple_impl<0UL,_bssl::SSLPAKEShare_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bssl::SSLPAKEShare_*,_false>._M_head_impl,
                   lhs_00.data_ = (pSVar9->server_identity).data_,
                   lhs_00.size_ = (pSVar9->server_identity).size_,
                   rhs_00.data_ = (cred->server_identity).data_,
                   rhs_00.size_ = (cred->server_identity).size_,
                   bVar15 = internal::operator!=(lhs_00,rhs_00), !bVar15)) {
                  SSL_CREDENTIAL_up_ref(cred);
                  extensions.child = (CBB *)0x0;
                  std::__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>::reset
                            ((__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter> *)this_00,
                             cred);
                  std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)&extensions);
                  pVVar31 = New<bssl::spake2plus::Verifier>();
                  extensions.child = (CBB *)0x0;
                  std::__uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>::reset
                            ((__uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter> *
                             )this_03,pVVar31);
                  std::unique_ptr<bssl::spake2plus::Verifier,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<bssl::spake2plus::Verifier,_bssl::internal::Deleter> *)
                             &extensions);
                  pVVar31 = (this_03->_M_t).
                            super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>
                            .super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl
                  ;
                  if (pVVar31 != (Verifier *)0x0) {
                    context.data_ = (cred->pake_context).data_;
                    context.size_ = (cred->pake_context).size_;
                    id_prover.data_ = (cred->client_identity).data_;
                    id_prover.size_ = (cred->client_identity).size_;
                    pAVar1 = &cred->server_identity;
                    extensions.child = (CBB *)pAVar1->data_;
                    in_stack_fffffffffffffce0 = (CBB *)(cred->server_identity).size_;
                    id_verifier.data_ = pAVar1->data_;
                    id_verifier.size_ = pAVar1->size_;
                    pAVar1 = &cred->password_verifier_w0;
                    sigalg = (uint16_t)pAVar1->data_;
                    uStack_1d6 = (undefined6)((ulong)pAVar1->data_ >> 0x10);
                    pCStack_1d0 = (CBB *)(cred->password_verifier_w0).size_;
                    w0.data_ = pAVar1->data_;
                    w0.size_ = pAVar1->size_;
                    pAVar1 = &cred->registration_record;
                    sigalg_contents.child = (CBB *)pAVar1->data_;
                    sigalg_contents._8_8_ = (cred->registration_record).size_;
                    registration_record.data_ = pAVar1->data_;
                    registration_record.size_ = pAVar1->size_;
                    sigalgs_cbb.child = (CBB *)0x0;
                    sigalgs_cbb.is_child = '\0';
                    sigalgs_cbb._9_7_ = 0;
                    uVar51 = SUB84(extensions.child,0);
                    uVar52 = (undefined4)((ulong)extensions.child >> 0x20);
                    extensions._8_8_ = in_stack_fffffffffffffce0;
                    bVar15 = spake2plus::Verifier::Init
                                       (pVVar31,context,id_prover,id_verifier,w0,registration_record
                                        ,(Span<const_unsigned_char>)ZEXT816(0));
                    contents = (CBB *)CONCAT44(uVar52,uVar51);
                    if (bVar15) break;
                  }
                  ssl_send_alert(pSVar40,2,0x50);
                  goto LAB_0023b508;
                }
                ERR_put_error(0x10,0,0x146,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                              ,0x12a);
              }
              else if (SVar3 == kX509) {
LAB_0023b0d2:
                bVar15 = tls1_choose_signature_algorithm(hs,cred,&sigalg);
                if ((bVar15) && (bVar15 = ssl_credential_matches_requested_issuers(hs,cred), bVar15)
                   ) {
                  SSL_CREDENTIAL_up_ref(cred);
                  extensions.child = (CBB *)0x0;
                  std::__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>::reset
                            ((__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter> *)this_00,
                             cred);
                  std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)&extensions);
                  hs->signature_algorithm = sigalg;
                  break;
                }
              }
              else {
                if (SVar3 == kDelegated) {
                  puVar28 = (hs->peer_sigalgs).data_;
                  puVar28 = std::
                            __find_if<unsigned_short*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_short_const>>
                                      (puVar28,puVar28 + (hs->peer_sigalgs).size_,
                                       &cred->dc_algorithm);
                  if (puVar28 != (hs->peer_sigalgs).data_ + (hs->peer_sigalgs).size_)
                  goto LAB_0023b0d2;
                  iVar41 = 0x10e;
                  iVar21 = 0xfd;
                }
                else {
                  iVar41 = 0x113;
                  iVar21 = 0xe4;
                }
                ERR_put_error(0x10,0,iVar21,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                              ,iVar41);
              }
            }
            sVar25 = client_hello.cipher_suites_len;
            puVar44 = client_hello.cipher_suites;
            if ((this_00->_M_t).super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
                _M_t.super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl ==
                (ssl_credential_st *)0x0) {
              uVar30 = ERR_peek_error();
              iVar21 = 0x28;
              if ((int)uVar30 == 0) {
                __assert_fail("ERR_peek_error() != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                              ,0x16f,
                              "enum ssl_hs_wait_t bssl::do_select_parameters(SSL_HANDSHAKE *)");
              }
              goto LAB_0023b438;
            }
            uVar19 = ssl_protocol_version(pSVar40);
            pSVar35 = (pSVar40->config)._M_t.
                      super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl;
            if ((*(ushort *)&pSVar35->field_0x10d >> 0xb & 1) == 0) {
              uVar24 = EVP_has_aes_hardware();
              pSVar35 = (pSVar40->config)._M_t.
                        super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl;
            }
            else {
              uVar24 = *(ushort *)&pSVar35->field_0x10d >> 0xc & 1;
            }
            cipher_suites.len._0_1_ = uVar24 != 0;
            cipher_suites.data = (uint8_t *)sVar25;
            cipher_suites.len._1_7_ = 0;
            pSVar29 = ssl_choose_tls13_cipher
                                ((bssl *)puVar44,cipher_suites,SUB21(uVar19,0),
                                 (uint16_t)pSVar35->compliance_policy,(ssl_compliance_policy_t)in_R9
                                );
            hs->new_cipher = pSVar29;
            if (pSVar29 == (SSL_CIPHER *)0x0) {
              ERR_put_error(0x10,0,0xb8,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                            ,0x177);
              ssl_send_alert(pSVar40,2,0x28);
            }
            else {
              aead_id._0_1_ = 0x32;
              bVar15 = ssl_negotiate_alpn(hs,(uint8_t *)&aead_id,&client_hello);
              if (bVar15) {
                uVar19 = ssl_protocol_version(pSVar40);
                bVar15 = SSLTranscript::InitHash(this_01,uVar19,hs->new_cipher);
                if (bVar15) {
                  hs->tls13_state = 1;
                  sVar37 = ssl_hs_ok;
                  goto LAB_0023b508;
                }
              }
              else {
                ssl_send_alert(pSVar40,2,(uint)(byte)aead_id);
              }
              sVar37 = ssl_hs_error;
            }
          }
LAB_0023b508:
          Array<ssl_credential_st_*>::~Array(&creds);
        }
        else {
          ERR_put_error(0x10,0,0x132,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,0x13c);
          iVar21 = 0x2f;
LAB_00239d20:
          ssl_send_alert(pSVar40,2,iVar21);
          sVar37 = ssl_hs_error;
        }
      }
      break;
    case 1:
      pSVar40 = hs->ssl;
      bVar15 = SSL_HANDSHAKE::GetClientHello(hs,(SSLMessage *)&extensions,&client_hello);
      sVar37 = ssl_hs_error;
      if (bVar15) {
        random.data_ = (uchar *)0x0;
        unused = true;
        pSVar26 = pSVar40->s3;
        pSVar6 = hs->ssl;
        std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)&random,(pointer)0x0)
        ;
        bVar15 = ssl_client_hello_get_extension(&client_hello,(CBS *)&msg,0x29);
        if (!bVar15) goto LAB_0023b5e4;
        bVar16 = ssl_client_hello_get_extension(&client_hello,(CBS *)&creds,0x2d);
        if (bVar16) {
          contents = (CBB *)&msg;
          in_R9 = &client_hello;
          bVar16 = ssl_ext_pre_shared_key_parse_clienthello
                             (hs,(CBS *)&sigalg,(CBS *)&sigalg_contents,(uint32_t *)&server_hello,
                              &unused,in_R9,(CBS *)contents);
          bVar43 = unused;
          if (!bVar16) goto LAB_0023b671;
          if (((hs->field_0x6c8 & 0x10) != 0) &&
             ((psVar4 = (this_00->_M_t).
                        super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl,
              psVar4 == (ssl_credential_st *)0x0 || (psVar4->type != kSPAKE2PlusV1Server)))) {
            _aead_id = (ssl_session_st *)0x0;
            ticket.data_._2_6_ = uStack_1d6;
            ticket.data_._0_2_ = sigalg;
            ticket.size_ = (size_t)pCStack_1d0;
            sigalgs_cbb.child = (CBB *)0x0;
            sigalgs_cbb.is_child = '\0';
            sigalgs_cbb._9_7_ = 0;
            uVar51 = 0;
            uVar52 = 0;
            in_stack_fffffffffffffce0 = (CBB *)0x0;
            sVar22 = ssl_process_ticket(hs,(UniquePtr<SSL_SESSION> *)&aead_id,(bool *)&alert,ticket,
                                        (Span<const_unsigned_char>)ZEXT816(0));
            if (sVar22 == ssl_ticket_aead_success) {
              bVar16 = ssl_session_is_resumable(hs,_aead_id);
              if ((bVar16) && ((_aead_id->field_0x1b8 & 8) != 0)) {
                server_hello.data_ =
                     (uchar *)CONCAT44(server_hello.data_._4_4_,
                                       ((int)server_hello.data_ - _aead_id->ticket_age_add) / 1000);
                OVar48 = ssl_ctx_get_current_time
                                   ((pSVar6->ctx)._M_t.
                                    super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
                if (OVar48.tv_sec < _aead_id->time) {
                  __assert_fail("now.tv_sec >= session->time",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                ,0x1d5,
                                "enum ssl_ticket_aead_result_t bssl::select_session(SSL_HANDSHAKE *, uint8_t *, UniquePtr<SSL_SESSION> *, int32_t *, bool *, const SSLMessage &, const SSL_CLIENT_HELLO *)"
                               );
                }
                uVar30 = OVar48.tv_sec - _aead_id->time;
                if (uVar30 < 0x80000000) {
                  pSVar26->ticket_age_skew = (int)server_hello.data_ - (int)uVar30;
                  bVar16 = tls13_verify_psk_binder
                                     (hs,_aead_id,(SSLMessage *)&extensions,(CBS *)&sigalg_contents)
                  ;
                  __p_00._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
                       (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
                       (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
                       _aead_id;
                  uVar32 = 0x33;
                  if (bVar16) {
                    _aead_id = (ssl_session_st *)0x0;
                    std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                              ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)&random,
                               (pointer)__p_00._M_t.
                                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl
                              );
                    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&aead_id);
                    SSL_SESSION_dup((bssl *)&msg,(SSL_SESSION *)random.data_,0);
                    uVar11 = msg._0_8_;
                    msg.is_v2_hello = false;
                    msg.type = '\0';
                    msg._2_6_ = 0;
                    std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                              ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)this,
                               (pointer)uVar11);
                    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&msg);
                    contents = (CBB *)CONCAT44(uVar52,uVar51);
                    if ((this->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
                        (ssl_session_st *)0x0) {
                      puVar39 = &pSVar40->s3->field_0xdc;
                      *(ushort *)puVar39 = *(ushort *)puVar39 | 0x20;
                      hs->field_0x6ca = hs->field_0x6ca | 0x80;
                      ssl_session_renew_timeout
                                (pSVar40,(hs->new_session)._M_t.
                                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                         _M_head_impl,
                                 ((pSVar40->session_ctx)._M_t.
                                  super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->
                                 session_psk_dhe_timeout);
                      contents = (CBB *)CONCAT44(uVar52,uVar51);
                      goto LAB_0023b5fe;
                    }
                    bVar43 = 0x50;
                    goto LAB_0023b671;
                  }
                  goto LAB_0023a782;
                }
              }
              std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&aead_id);
              contents = (CBB *)CONCAT44(uVar52,uVar51);
              goto LAB_0023b5e4;
            }
            uVar32 = 0x50;
            if (sVar22 == ssl_ticket_aead_error) {
LAB_0023a782:
              unused = (bool)uVar32;
              std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&aead_id);
              contents = (CBB *)CONCAT44(uVar52,uVar51);
              bVar43 = unused;
              goto LAB_0023b671;
            }
            std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&aead_id);
            contents = (CBB *)CONCAT44(uVar52,uVar51);
            if (sVar22 != ssl_ticket_aead_retry) {
              if (sVar22 == ssl_ticket_aead_ignore_ticket) goto LAB_0023b5e4;
              goto LAB_0023b5fe;
            }
            hs->tls13_state = 1;
            sVar37 = ssl_hs_pending_ticket;
            goto LAB_0023b68b;
          }
LAB_0023b5e4:
          if (random.data_ != (uchar *)0x0) {
            __assert_fail("!session",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                          ,0x20a,"enum ssl_hs_wait_t bssl::do_select_session(SSL_HANDSHAKE *)");
          }
          bVar16 = ssl_get_new_session(hs);
          bVar43 = 0x50;
          if (!bVar16) goto LAB_0023b671;
LAB_0023b5fe:
          bVar16 = ssl_negotiate_alps(hs,&unused,&client_hello);
          bVar43 = unused;
          if (!bVar16) goto LAB_0023b671;
          ((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
           _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->cipher = hs->new_cipher;
          if ((hs->pake_verifier)._M_t.
              super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl ==
              (Verifier *)0x0) {
            bVar16 = tls1_get_shared_group
                               (hs,&((hs->new_session)._M_t.
                                     super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                                    group_id);
            if (!bVar16) {
              ERR_put_error(0x10,0,0x10a,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                            ,0x23b);
              iVar21 = 0x28;
              goto LAB_0023bc26;
            }
            bVar16 = ssl_ext_key_share_parse_clienthello
                               (hs,&msg.is_v2_hello,(Span<const_unsigned_char> *)0x0,&unused,
                                &client_hello);
            if (bVar16) {
              bVar43 = msg.is_v2_hello ^ 1;
              goto LAB_0023b649;
            }
            ssl_send_alert(pSVar40,2,(uint)unused);
LAB_0023bc31:
            sVar37 = ssl_hs_error;
          }
          else {
            bVar43 = 0;
LAB_0023b649:
            if ((pSVar40->field_0xa4 & 4) == 0) {
              pSVar26 = pSVar40->s3;
              pSVar26->early_data_reason = ssl_early_data_disabled;
            }
            else if (bVar15) {
              if (random.data_ == (uchar *)0x0) {
                pSVar26 = pSVar40->s3;
                pSVar26->early_data_reason = ssl_early_data_session_not_resumed;
              }
              else if (*(int *)(random.data_ + 0x184) == 0) {
                pSVar26 = pSVar40->s3;
                pSVar26->early_data_reason = ssl_early_data_unsupported_for_session;
              }
              else if ((*(uint *)&hs->field_0x6c8 >> 0xb & 1) == 0) {
                pSVar26 = pSVar40->s3;
                pSVar26->early_data_reason = ssl_early_data_peer_declined;
              }
              else {
                pSVar26 = pSVar40->s3;
                if ((*(uint *)&hs->field_0x6c8 >> 0x18 & 1) == 0) {
                  lhs_01.data_ = (pSVar26->alpn_selected).data_;
                  lhs_01.size_ = (pSVar26->alpn_selected).size_;
                  bVar15 = internal::operator!=
                                     (lhs_01,*(Span<const_unsigned_char> *)(random.data_ + 0x188));
                  if (bVar15) {
                    pSVar26 = pSVar40->s3;
                    pSVar26->early_data_reason = ssl_early_data_alpn_mismatch;
                  }
                  else {
                    psVar7 = (this->_M_t).
                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                    if ((((random.data_[0x1b8] ^ psVar7->field_0x1b8) & 0x40) != 0) ||
                       (lhs_02.data_ = (psVar7->local_application_settings).data_,
                       lhs_02.size_ = (psVar7->local_application_settings).size_,
                       bVar15 = internal::operator!=
                                          (lhs_02,*(Span<const_unsigned_char> *)
                                                   (random.data_ + 0x198)), bVar15)) {
                      pSVar26 = pSVar40->s3;
                      pSVar26->early_data_reason = ssl_early_data_alps_mismatch;
                    }
                    else {
                      pSVar26 = pSVar40->s3;
                      if (pSVar26->ticket_age_skew - 0x3dU < 0xffffff87) {
                        pSVar26->early_data_reason = ssl_early_data_ticket_age_skew;
                      }
                      else if ((random.data_[0x1b8] & 0x20) == 0) {
LAB_0023bee7:
                        if (bVar43 == 0) {
                          if (hs->new_cipher != *(SSL_CIPHER **)(random.data_ + 0xd8)) {
                            __assert_fail("hs->new_cipher == session->cipher",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                          ,0x269,
                                          "enum ssl_hs_wait_t bssl::do_select_session(SSL_HANDSHAKE *)"
                                         );
                          }
                          pSVar26 = pSVar40->s3;
                          pSVar26->early_data_reason = ssl_early_data_accepted;
                          puVar39 = &pSVar26->field_0xdd;
                          *puVar39 = *puVar39 | 2;
                          pSVar26 = pSVar40->s3;
                        }
                        else {
                          pSVar26 = pSVar40->s3;
                          pSVar26->early_data_reason = ssl_early_data_hello_retry_request;
                        }
                      }
                      else {
                        len = *(size_t *)(random.data_ + 0x1c8);
                        if ((len != 0) && ((hs->config->quic_early_data_context).size_ == len)) {
                          iVar21 = CRYPTO_memcmp((hs->config->quic_early_data_context).data_,
                                                 *(void **)(random.data_ + 0x1c0),len);
                          if (iVar21 == 0) goto LAB_0023bee7;
                          pSVar26 = pSVar40->s3;
                        }
                        pSVar26->early_data_reason = ssl_early_data_quic_parameter_mismatch;
                      }
                    }
                  }
                }
                else {
                  pSVar26->early_data_reason = ssl_early_data_channel_id;
                }
              }
            }
            else {
              pSVar26 = pSVar40->s3;
              pSVar26->early_data_reason = ssl_early_data_no_session_offered;
            }
            in.data_ = (pSVar26->alpn_selected).data_;
            in.size_ = (pSVar26->alpn_selected).size_;
            bVar15 = Array<unsigned_char>::CopyFrom
                               (&((this->_M_t).
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                                 early_alpn,in);
            iVar21 = 0x50;
            if (!bVar15) {
LAB_0023bc26:
              ssl_send_alert(pSVar40,2,iVar21);
              goto LAB_0023bc31;
            }
            if (((pSVar40->s3->field_0xdd & 2) != 0) &&
               (psVar7 = (this->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                         ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
               (psVar7->field_0x1b8 & 0x40) != 0)) {
              bVar15 = Array<unsigned_char>::CopyFrom
                                 (&psVar7->peer_application_settings,
                                  *(Span<const_unsigned_char> *)(random.data_ + 0x1a8));
              iVar21 = 0x50;
              if (!bVar15) goto LAB_0023bc26;
            }
            if (((pSVar40->field_0xa4 & 4) != 0) && (iVar21 = SSL_is_quic(pSVar40), iVar21 != 0)) {
              in_00.data_ = (hs->config->quic_early_data_context).data_;
              in_00.size_ = (hs->config->quic_early_data_context).size_;
              bVar15 = Array<unsigned_char>::CopyFrom
                                 (&((hs->new_session)._M_t.
                                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                                   quic_early_data_context,in_00);
              iVar21 = 0x50;
              if (!bVar15) goto LAB_0023bc26;
            }
            p_Var8 = ((pSVar40->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>
                      ._M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->dos_protection_cb;
            if ((p_Var8 != (_func_int_SSL_CLIENT_HELLO_ptr *)0x0) &&
               (iVar21 = (*p_Var8)(&client_hello), iVar21 == 0)) {
              ERR_put_error(0x10,0,0x85,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                            ,0x28e);
              iVar21 = 0x50;
              goto LAB_0023bc26;
            }
            uVar19 = ssl_protocol_version(pSVar40);
            md = (EVP_MD *)ssl_get_handshake_digest(uVar19,hs->new_cipher);
            iVar21 = EVP_MD_size(md);
            uVar30 = CONCAT44(extraout_var,iVar21);
            puVar39 = kZeroes;
            if ((pSVar40->s3->field_0xdc & 0x20) != 0) {
              psVar7 = (this->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                       _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
              uVar30 = (ulong)(psVar7->secret).size_;
              puVar39 = (psVar7->secret).storage_;
            }
            psk.size_ = uVar30;
            psk.data_ = puVar39;
            bVar15 = tls13_init_key_schedule(hs,psk);
            sVar33 = ssl_hs_error;
            sVar38 = ssl_hs_error;
            sVar37 = sVar33;
            if ((bVar15) && (bVar15 = ssl_hash_message(hs,(SSLMessage *)&extensions), bVar15)) {
              uVar24 = *(uint *)&pSVar40->s3->field_0xdc;
              sVar37 = sVar38;
              if ((uVar24 >> 9 & 1) == 0) {
                if ((hs->field_0x6c9 & 8) != 0) {
                  *(ushort *)&pSVar40->s3->field_0xdc = (ushort)uVar24 | 1;
                }
              }
              else {
                bVar15 = tls13_derive_early_secret(hs);
                if (!bVar15) goto LAB_0023b68b;
              }
              if (bVar43 == 0) {
                if ((this_03->_M_t).
                    super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl ==
                    (Verifier *)0x0) {
                  bVar15 = resolve_ecdhe_secret(hs,&client_hello);
                  if (bVar15) {
LAB_0023bdf1:
                    (*pSVar40->method->next_message)(pSVar40);
                    Array<unsigned_char>::Reset(local_178);
                    hs->tls13_state = 4;
                    goto LAB_0023be0e;
                  }
                }
                else {
                  if ((pSVar40->s3->field_0xdc & 0x20) != 0) {
                    __assert_fail("!ssl->s3->session_reused",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                  ,0x2b0,
                                  "enum ssl_hs_wait_t bssl::do_select_session(SSL_HANDSHAKE *)");
                  }
                  bVar15 = ssl_credential_st::ClaimPAKEAttempt
                                     ((this_00->_M_t).
                                      super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ssl_credential_st_*,_false>.
                                      _M_head_impl);
                  if (bVar15) {
                    sigalgs_cbb.child = &sigalg_contents;
                    sigalgs_cbb.is_child = ' ';
                    sigalgs_cbb._9_7_ = 0;
                    pSVar9 = (hs->pake_share)._M_t.
                             super___uniq_ptr_impl<bssl::SSLPAKEShare,_bssl::internal::Deleter>._M_t
                             .super__Tuple_impl<0UL,_bssl::SSLPAKEShare_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bssl::SSLPAKEShare_*,_false>._M_head_impl;
                    pAVar1 = &pSVar9->pake_message;
                    _aead_id = (ssl_session_st *)pAVar1->data_;
                    sStack_1a0 = (pSVar9->pake_message).size_;
                    prover_share.data_ = pAVar1->data_;
                    prover_share.size_ = pAVar1->size_;
                    in_stack_fffffffffffffce0 = (CBB *)&DAT_00000020;
                    puVar36 = &sigalg;
                    SVar49.size_ = 0x20;
                    SVar49.data_ = (uchar *)sigalgs_cbb.child;
                    SVar50.size_ = 0x41;
                    SVar50.data_ = &msg.is_v2_hello;
                    out_confirm.size_ = 0x20;
                    out_confirm.data_ = (uchar *)puVar36;
                    contents = sigalgs_cbb.child;
                    bVar15 = spake2plus::Verifier::ProcessProverShare
                                       ((hs->pake_verifier)._M_t.
                                        super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>.
                                        _M_head_impl,SVar50,out_confirm,SVar49,prover_share);
                    if (bVar15) {
                      CBB_zero((CBB *)&creds);
                      iVar21 = CBB_init((CBB *)&creds,0x61);
                      if ((((iVar21 == 0) ||
                           (iVar21 = CBB_add_bytes((CBB *)&creds,&msg.is_v2_hello,0x41), iVar21 == 0
                           )) || (iVar21 = CBB_add_bytes((CBB *)&creds,(uint8_t *)&sigalg,0x20),
                                 iVar21 == 0)) ||
                         (bVar15 = CBBFinishArray((CBB *)&creds,&hs->pake_share_bytes), !bVar15)) {
                        internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::
                        ~StackAllocated((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                        &creds);
                      }
                      else {
                        in_08.size_ = (size_t)puVar36;
                        in_08.data_ = &DAT_00000020;
                        bVar15 = tls13_advance_key_schedule
                                           ((bssl *)hs,(SSL_HANDSHAKE *)&sigalg_contents,in_08);
                        internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::
                        ~StackAllocated((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                        &creds);
                        if (bVar15) goto LAB_0023bdf1;
                      }
                    }
                    else {
                      ERR_put_error(0x10,0,0x89,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                    ,0x35);
                      ssl_send_alert(hs->ssl,2,0x2f);
                    }
                  }
                  else {
                    ERR_put_error(0x10,0,0x145,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                  ,0x2b4);
                    ssl_send_alert(hs->ssl,2,0x50);
                  }
                }
              }
              else {
                (*pSVar40->method->next_message)(pSVar40);
                bVar15 = SSLTranscript::UpdateForHelloRetryRequest(this_01);
                sVar37 = sVar33;
                if (bVar15) {
                  hs->tls13_state = 2;
LAB_0023be0e:
                  sVar37 = ssl_hs_ok;
                }
              }
            }
          }
        }
        else {
          unused = true;
          ERR_put_error(0x10,0,0xa4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,0x1a1);
          bVar43 = unused;
LAB_0023b671:
          ssl_send_alert(pSVar40,2,(uint)bVar43);
          sVar37 = ssl_hs_error;
        }
LAB_0023b68b:
        std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&random);
      }
      break;
    case 2:
      sVar37 = ssl_hs_hints_ready;
      if ((hs->field_0x6ca & 0x10) == 0) {
        if ((this_03->_M_t).
            super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl !=
            (Verifier *)0x0) {
          __assert_fail("hs->pake_verifier == nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,0x2cf,
                        "enum ssl_hs_wait_t bssl::do_send_hello_retry_request(SSL_HANDSHAKE *)");
        }
        pSVar40 = hs->ssl;
        CBB_zero((CBB *)&client_hello);
        bVar15 = (*pSVar40->method->init_message)(pSVar40,(CBB *)&client_hello,(CBB *)&msg,'\x02');
        sVar37 = ssl_hs_error;
        sVar33 = ssl_hs_error;
        if (bVar15) {
          iVar21 = SSL_is_dtls(pSVar40);
          uVar19 = 0xfefd;
          if (iVar21 == 0) {
            uVar19 = 0x303;
          }
          iVar21 = CBB_add_u16((CBB *)&msg,uVar19);
          if ((((iVar21 != 0) &&
               (iVar21 = CBB_add_bytes((CBB *)&msg,kHelloRetryRequest,0x20), iVar21 != 0)) &&
              (iVar21 = CBB_add_u8_length_prefixed((CBB *)&msg,(CBB *)&creds), sVar37 = sVar33,
              iVar21 != 0)) &&
             (iVar21 = CBB_add_bytes((CBB *)&creds,(uint8_t *)local_170,
                                     (ulong)(hs->session_id).size_), iVar21 != 0)) {
            uVar19 = SSL_CIPHER_get_protocol_id(hs->new_cipher);
            iVar21 = CBB_add_u16((CBB *)&msg,uVar19);
            if (((((iVar21 != 0) && (iVar21 = CBB_add_u8((CBB *)&msg,'\0'), iVar21 != 0)) &&
                 ((iVar21 = CBB_add_u16_length_prefixed((CBB *)&msg,&extensions), iVar21 != 0 &&
                  ((iVar21 = CBB_add_u16(&extensions,0x2b), iVar21 != 0 &&
                   (iVar21 = CBB_add_u16(&extensions,2), iVar21 != 0)))))) &&
                ((iVar21 = CBB_add_u16(&extensions,pSVar40->s3->version), iVar21 != 0 &&
                 (((iVar21 = CBB_add_u16(&extensions,0x33), iVar21 != 0 &&
                   (iVar21 = CBB_add_u16(&extensions,2), iVar21 != 0)) &&
                  (iVar21 = CBB_add_u16(&extensions,
                                        ((this->_M_t).
                                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                        _M_head_impl)->group_id), iVar21 != 0)))))) &&
               (((hs->field_0x6c8 & 1) == 0 ||
                (((iVar21 = CBB_add_u16(&extensions,0xfe0d), iVar21 != 0 &&
                  (iVar21 = CBB_add_u16(&extensions,8), iVar21 != 0)) &&
                 (iVar21 = CBB_add_zeros(&extensions,8), iVar21 != 0)))))) {
              sigalg = 0;
              uStack_1d6 = 0;
              pCStack_1d0 = (CBB *)0x0;
              bVar15 = (*pSVar40->method->finish_message)
                                 (pSVar40,(CBB *)&client_hello,(Array<unsigned_char> *)&sigalg);
              pCVar53 = pCStack_1d0;
              uVar51 = (undefined4)((ulong)contents >> 0x20);
              sVar37 = ssl_hs_error;
              if (bVar15) {
                if ((hs->field_0x6c8 & 1) != 0) {
                  sigalg_contents.child = (CBB *)CONCAT62(uStack_1d6,sigalg);
                  sigalg_contents._8_8_ = pCStack_1d0;
                  SVar49 = Span<unsigned_char>::last((Span<unsigned_char> *)&sigalg_contents,8);
                  client_random.data_ = pSVar40->s3->client_random;
                  in_stack_fffffffffffffce0 = (CBB *)CONCAT62(uStack_1d6,sigalg);
                  sigalgs_cbb._8_8_ = pCStack_1d0;
                  uVar52 = 1;
                  msg_00.size_ = (size_t)pCStack_1d0;
                  msg_00.data_ = (uchar *)in_stack_fffffffffffffce0;
                  client_random.size_ = 0x20;
                  in_R9 = (SSL_CLIENT_HELLO *)this_01;
                  sigalgs_cbb.child = in_stack_fffffffffffffce0;
                  bVar15 = ssl_ech_accept_confirmation
                                     (hs,SVar49,client_random,this_01,true,msg_00,
                                      (size_t)((long)&pCVar53[-1].u + 0x18));
                  contents = (CBB *)CONCAT44(uVar51,uVar52);
                  if (!bVar15) goto LAB_0023c0ea;
                }
                p_Var10 = pSVar40->method->add_message;
                Array<unsigned_char>::Array
                          ((Array<unsigned_char> *)&sigalg_contents,(Array<unsigned_char> *)&sigalg)
                ;
                AVar46.size_ = extraout_RDX;
                AVar46.data_ = (uchar *)&sigalg_contents;
                bVar15 = (*p_Var10)(pSVar40,AVar46);
                if (bVar15) {
                  bVar15 = (*pSVar40->method->add_change_cipher_spec)(pSVar40);
                  Array<unsigned_char>::~Array((Array<unsigned_char> *)&sigalg_contents);
                  if (bVar15) {
                    puVar39 = &pSVar40->s3->field_0xdc;
                    *(ushort *)puVar39 = *(ushort *)puVar39 | 0x1000;
                    hs->tls13_state = 3;
                    sVar37 = ssl_hs_flush;
                  }
                }
                else {
                  Array<unsigned_char>::~Array((Array<unsigned_char> *)&sigalg_contents);
                  sVar37 = ssl_hs_error;
                }
              }
LAB_0023c0ea:
              Array<unsigned_char>::~Array((Array<unsigned_char> *)&sigalg);
            }
          }
        }
        internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                  ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&client_hello);
      }
      break;
    case 3:
      pSVar40 = hs->ssl;
      bVar15 = (*pSVar40->method->get_message)(pSVar40,&msg);
      sVar37 = ssl_hs_read_message;
      if (bVar15) {
        bVar15 = ssl_check_message_type(pSVar40,&msg,1);
        sVar37 = ssl_hs_error;
        if (bVar15) {
          pCVar53 = contents;
          iVar21 = SSL_parse_client_hello(pSVar40,&client_hello,msg.body.data,msg.body.len);
          if (iVar21 == 0) {
            uVar24 = 0x32;
            goto LAB_0023b1d0;
          }
          pSVar26 = pSVar40->s3;
          contents = pCVar53;
          if (pSVar26->ech_status == ssl_ech_accepted) {
            bVar15 = ssl_client_hello_get_extension(&client_hello,(CBS *)&creds,0xfe0d);
            if (bVar15) {
              iVar21 = CBS_get_u8((CBS *)&creds,(uint8_t *)&random);
              iVar41 = 0x32a;
              if ((((((iVar21 == 0) || ((char)random.data_ != '\0')) ||
                    (iVar21 = CBS_get_u16((CBS *)&creds,(uint16_t *)&sigalgs_cbb), iVar21 == 0)) ||
                   ((iVar21 = CBS_get_u16((CBS *)&creds,&aead_id), iVar21 == 0 ||
                    (iVar21 = CBS_get_u8((CBS *)&creds,(uint8_t *)&server_hello), iVar21 == 0)))) ||
                  (iVar21 = CBS_get_u16_length_prefixed((CBS *)&creds,(CBS *)&extensions),
                  iVar21 == 0)) ||
                 (iVar21 = CBS_get_u16_length_prefixed((CBS *)&creds,(CBS *)&sigalg), iVar21 == 0))
              {
                iVar21 = 0x32;
              }
              else {
                iVar21 = 0x32;
                iVar41 = 0x32a;
                if (creds.size_ == 0) {
                  uVar19 = (uint16_t)sigalgs_cbb.child;
                  kdf = EVP_HPKE_CTX_kdf(&(hs->ech_hpke_ctx).ctx_);
                  uVar17 = EVP_HPKE_KDF_id(kdf);
                  iVar41 = 0x333;
                  if (uVar19 == uVar17) {
                    uVar19 = aead_id;
                    aead = EVP_HPKE_CTX_aead(&(hs->ech_hpke_ctx).ctx_);
                    uVar17 = EVP_HPKE_AEAD_id(aead);
                    if ((uVar19 == uVar17) && ((uint8_t)server_hello.data_ == hs->ech_config_id)) {
                      iVar21 = 0x2f;
                      iVar41 = 0x333;
                      if (extensions._8_8_ != 0) goto LAB_0023b2d5;
                      _alert = (uchar *)CONCAT71(uStack_127,0x32);
                      sigalg_contents.child = (CBB *)CONCAT62(uStack_1d6,sigalg);
                      sigalg_contents._8_8_ = pCStack_1d0;
                      uVar51 = SUB84(sigalg_contents.child,0);
                      uVar52 = (undefined4)((uint6)uStack_1d6 >> 0x10);
                      payload.data_._4_4_ = uVar52;
                      payload.data_._0_4_ = uVar51;
                      payload.size_ = (size_t)pCStack_1d0;
                      in_stack_fffffffffffffce0 = pCStack_1d0;
                      bVar15 = ssl_client_hello_decrypt
                                         (hs,&alert,&unused,local_178,&client_hello,payload);
                      if (!bVar15) {
                        ERR_put_error(0x10,0,0x8a,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                      ,0x33f);
                        pCVar53 = (CBB *)CONCAT44(uVar52,uVar51);
                        uVar24 = (uint)alert;
                        goto LAB_0023b1d0;
                      }
                      bVar15 = SSL_HANDSHAKE::GetClientHello(hs,&msg,&client_hello);
                      contents = (CBB *)CONCAT44(uVar52,uVar51);
                      if (bVar15) {
                        pSVar26 = pSVar40->s3;
                        goto LAB_0023a56f;
                      }
                      ERR_put_error(0x10,0,0x44,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                    ,0x346);
                      contents = (CBB *)CONCAT44(uVar52,uVar51);
                      goto LAB_0023b1d5;
                    }
                  }
                  iVar21 = 0x2f;
                }
              }
LAB_0023b2d5:
              contents = pCVar53;
              ERR_put_error(0x10,0,0x89,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                            ,iVar41);
            }
            else {
              contents = pCVar53;
              ERR_put_error(0x10,0,0xa4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                            ,0x31b);
              iVar21 = 0x6d;
            }
LAB_0023b35b:
            sVar37 = ssl_hs_error;
            ssl_send_alert(pSVar40,2,iVar21);
          }
          else {
LAB_0023a56f:
            pCVar53 = (CBB *)&creds;
            if ((pSVar26->field_0xdc & 0x20) == 0) {
LAB_0023a58c:
              if ((this_03->_M_t).
                  super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl !=
                  (Verifier *)0x0) {
                __assert_fail("hs->pake_verifier == nullptr",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                              ,0x370,
                              "enum ssl_hs_wait_t bssl::do_read_second_client_hello(SSL_HANDSHAKE *)"
                             );
              }
              bVar15 = resolve_ecdhe_secret(hs,&client_hello);
              sVar37 = ssl_hs_error;
              if ((bVar15) && (bVar15 = ssl_hash_message(hs,&msg), sVar37 = ssl_hs_error, bVar15)) {
                bVar15 = (*pSVar40->method->has_unprocessed_handshake_data)(pSVar40);
                if (bVar15) {
                  ssl_send_alert(pSVar40,2,10);
                  sVar37 = ssl_hs_error;
                  ERR_put_error(0x10,0,0xff,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                ,0x37c);
                }
                else {
                  (*pSVar40->method->next_message)(pSVar40);
                  Array<unsigned_char>::Reset(local_178);
                  hs->tls13_state = 4;
                  sVar37 = ssl_hs_ok;
                }
              }
            }
            else {
              client_hello_00 = &client_hello;
              bVar15 = ssl_client_hello_get_extension(client_hello_00,(CBS *)pCVar53,0x29);
              if (!bVar15) {
                ERR_put_error(0x10,0,0x12f,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                              ,0x356);
                iVar21 = 0x2f;
                goto LAB_0023b35b;
              }
              aead_id._0_1_ = 0x32;
              bVar15 = ssl_ext_pre_shared_key_parse_clienthello
                                 (hs,(CBS *)&extensions,(CBS *)&sigalg,(uint32_t *)&sigalgs_cbb,
                                  (uint8_t *)&aead_id,client_hello_00,(CBS *)pCVar53);
              if (bVar15) {
                bVar15 = tls13_verify_psk_binder
                                   (hs,(hs->new_session)._M_t.
                                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                                    &msg,(CBS *)&sigalg);
                uVar24 = 0x33;
                in_R9 = client_hello_00;
                contents = pCVar53;
                if (bVar15) goto LAB_0023a58c;
              }
              else {
                uVar24 = (uint)(byte)aead_id;
                in_R9 = client_hello_00;
              }
LAB_0023b1d0:
              ssl_send_alert(pSVar40,2,uVar24);
              contents = pCVar53;
LAB_0023b1d5:
              sVar37 = ssl_hs_error;
            }
          }
        }
      }
      break;
    case 4:
      pSVar40 = hs->ssl;
      pSVar26 = pSVar40->s3;
      puVar44 = pSVar26->server_random;
      random.size_ = 0x20;
      pSVar5 = (hs->hints)._M_t.
               super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl;
      random.data_ = puVar44;
      if (pSVar5 == (SSL_HANDSHAKE_HINTS *)0x0) {
        RAND_bytes(puVar44,0x20);
      }
      else if (((hs->field_0x6ca & 0x10) == 0) && ((pSVar5->server_random_tls13).size_ == 0x20)) {
        puVar27 = (pSVar5->server_random_tls13).data_;
        uVar11 = *(undefined8 *)puVar27;
        uVar12 = *(undefined8 *)(puVar27 + 8);
        uVar13 = *(undefined8 *)(puVar27 + 0x18);
        *(undefined8 *)(pSVar26->server_random + 0x10) = *(undefined8 *)(puVar27 + 0x10);
        *(undefined8 *)(pSVar26->server_random + 0x18) = uVar13;
        *(undefined8 *)puVar44 = uVar11;
        *(undefined8 *)(pSVar26->server_random + 8) = uVar12;
      }
      else {
        RAND_bytes(puVar44,0x20);
        if ((hs->field_0x6ca & 0x10) != 0) {
          in_06.size_ = 0x20;
          in_06.data_ = puVar44;
          bVar15 = Array<unsigned_char>::CopyFrom(&pSVar5->server_random_tls13,in_06);
          sVar37 = ssl_hs_error;
          if (!bVar15) break;
        }
      }
      server_hello.data_ = (uchar *)0x0;
      server_hello.size_ = 0;
      CBB_zero((CBB *)&msg);
      bVar15 = (*pSVar40->method->init_message)(pSVar40,(CBB *)&msg,(CBB *)&creds,'\x02');
      sVar37 = ssl_hs_error;
      if (bVar15) {
        iVar21 = SSL_is_dtls(pSVar40);
        uVar19 = 0xfefd;
        if (iVar21 == 0) {
          uVar19 = 0x303;
        }
        iVar21 = CBB_add_u16((CBB *)&creds,uVar19);
        if (((iVar21 != 0) &&
            (iVar21 = CBB_add_bytes((CBB *)&creds,pSVar40->s3->server_random,0x20), iVar21 != 0)) &&
           ((iVar21 = CBB_add_u8_length_prefixed((CBB *)&creds,(CBB *)&sigalg), iVar21 != 0 &&
            (iVar21 = CBB_add_bytes((CBB *)&sigalg,(uint8_t *)local_170,
                                    (ulong)(hs->session_id).size_), iVar21 != 0)))) {
          uVar19 = SSL_CIPHER_get_protocol_id(hs->new_cipher);
          iVar21 = CBB_add_u16((CBB *)&creds,uVar19);
          if (((((((iVar21 != 0) && (iVar21 = CBB_add_u8((CBB *)&creds,'\0'), iVar21 != 0)) &&
                 (iVar21 = CBB_add_u16_length_prefixed((CBB *)&creds,&extensions), iVar21 != 0)) &&
                ((bVar15 = ssl_ext_pre_shared_key_add_serverhello(hs,&extensions), bVar15 &&
                 (bVar15 = ssl_ext_pake_add_serverhello(hs,&extensions), bVar15)))) &&
               (bVar15 = ssl_ext_key_share_add_serverhello(hs,&extensions), bVar15)) &&
              ((iVar21 = CBB_add_u16(&extensions,0x2b), iVar21 != 0 &&
               (iVar21 = CBB_add_u16_length_prefixed(&extensions,(CBB *)&client_hello), iVar21 != 0)
               ))) && ((iVar21 = CBB_add_u16((CBB *)&client_hello,hs->ssl->s3->version), iVar21 != 0
                       && (iVar21 = CBB_flush(&extensions), iVar21 != 0)))) {
            bVar15 = (*pSVar40->method->finish_message)(pSVar40,(CBB *)&msg,&server_hello);
            uVar51 = (undefined4)((ulong)contents >> 0x20);
            if (bVar15) {
              if (pSVar40->s3->ech_status == ssl_ech_accepted) {
                if ((hs->field_0x6c8 & 1) == 0) {
                  __assert_fail("ssl->s3->ech_status != ssl_ech_accepted || hs->ech_is_inner",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                ,0x3ae,
                                "enum ssl_hs_wait_t bssl::do_send_server_hello(SSL_HANDSHAKE *)");
                }
LAB_0023bf10:
                sVar25 = ssl_ech_confirmation_signal_hello_offset(pSVar40);
                SVar49 = Span<unsigned_char>::last(&random,8);
                client_random_00.data_ = pSVar40->s3->client_random;
                _alert = server_hello.data_;
                sStack_120 = server_hello.size_;
                uVar52 = 0;
                msg_01.size_ = server_hello.size_;
                msg_01.data_ = server_hello.data_;
                client_random_00.size_ = 0x20;
                in_R9 = (SSL_CLIENT_HELLO *)this_01;
                in_stack_fffffffffffffce0 = (CBB *)server_hello.data_;
                bVar15 = ssl_ech_accept_confirmation
                                   (hs,SVar49,client_random_00,this_01,false,msg_01,sVar25);
                contents = (CBB *)CONCAT44(uVar51,uVar52);
                if (!bVar15) goto LAB_0023c355;
                client_hello.ssl = (SSL *)server_hello.data_;
                client_hello.client_hello = (uint8_t *)server_hello.size_;
                SVar50 = Span<unsigned_char>::subspan((Span<unsigned_char> *)&client_hello,sVar25,8)
                ;
                contents = (CBB *)CONCAT44(uVar51,uVar52);
                *(undefined8 *)SVar50.data_ = *(undefined8 *)SVar49.data_;
              }
              else if ((hs->field_0x6c8 & 1) != 0) goto LAB_0023bf10;
              p_Var10 = pSVar40->method->add_message;
              Array<unsigned_char>::Array((Array<unsigned_char> *)&unused,&server_hello);
              AVar47.size_ = extraout_RDX_00;
              AVar47.data_ = (uchar *)&unused;
              bVar15 = (*p_Var10)(pSVar40,AVar47);
              Array<unsigned_char>::~Array((Array<unsigned_char> *)&unused);
              if ((bVar15) &&
                 (((Array<unsigned_char>::Reset(&hs->key_share_ciphertext),
                   (pSVar40->s3->field_0xdd & 0x10) != 0 ||
                   (bVar15 = (*pSVar40->method->add_change_cipher_spec)(pSVar40), bVar15)) &&
                  (bVar15 = tls13_derive_handshake_secrets(hs), bVar15)))) {
                in_R9 = (SSL_CLIENT_HELLO *)(ulong)(hs->server_handshake_secret).size_;
                traffic_secret_04.size_ = (size_t)in_stack_fffffffffffffce0;
                traffic_secret_04.data_ = (uchar *)contents;
                bVar15 = tls13_set_traffic_key
                                   ((bssl *)pSVar40,(SSL *)0x2,ssl_encryption_early_data,
                                    (evp_aead_direction_t)
                                    (hs->new_session)._M_t.
                                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                                    (SSL_SESSION *)&hs->server_handshake_secret,traffic_secret_04);
                if ((((bVar15) &&
                     (bVar15 = (*pSVar40->method->init_message)
                                         (pSVar40,(CBB *)&msg,(CBB *)&creds,'\b'), bVar15)) &&
                    (bVar15 = ssl_add_serverhello_tlsext(hs,(CBB *)&creds), bVar15)) &&
                   (bVar15 = ssl_add_message_cbb(pSVar40,(CBB *)&msg), bVar15)) {
                  if ((pSVar40->s3->field_0xdc & 0x20) == 0) {
                    uVar24 = *(uint *)&hs->field_0x6c8;
                    if ((hs->pake_verifier)._M_t.
                        super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>.
                        _M_t.
                        super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>
                        .super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl ==
                        (Verifier *)0x0) {
                      uVar24 = uVar24 & 0xffffffdf | (*(uint *)&hs->config->verify_mode & 1) << 5;
                      *(uint *)&hs->field_0x6c8 = uVar24;
                    }
                  }
                  else {
                    uVar24 = *(uint *)&hs->field_0x6c8;
                  }
                  if (((uVar24 & 0x20) == 0) ||
                     (((((bVar15 = (*pSVar40->method->init_message)
                                             (pSVar40,(CBB *)&msg,(CBB *)&creds,'\r'), bVar15 &&
                         (iVar21 = CBB_add_u8((CBB *)&creds,'\0'), iVar21 != 0)) &&
                        (((iVar21 = CBB_add_u16_length_prefixed((CBB *)&creds,(CBB *)&client_hello),
                          iVar21 != 0 &&
                          (((iVar21 = CBB_add_u16((CBB *)&client_hello,0xd), iVar21 != 0 &&
                            (iVar21 = CBB_add_u16_length_prefixed
                                                ((CBB *)&client_hello,&sigalg_contents), iVar21 != 0
                            )) && (iVar21 = CBB_add_u16_length_prefixed
                                                      (&sigalg_contents,&sigalgs_cbb), iVar21 != 0))
                          )) && (bVar15 = tls12_add_verify_sigalgs(hs,&sigalgs_cbb), bVar15)))) &&
                       ((bVar15 = ssl_has_client_CAs(hs->config), !bVar15 ||
                        (((iVar21 = CBB_add_u16((CBB *)&client_hello,0x2f), iVar21 != 0 &&
                          (iVar21 = CBB_add_u16_length_prefixed
                                              ((CBB *)&client_hello,(CBB *)&aead_id), iVar21 != 0))
                         && ((bVar15 = ssl_add_client_CA_list(hs,(CBB *)&aead_id), bVar15 &&
                             (iVar21 = CBB_flush((CBB *)&client_hello), iVar21 != 0)))))))) &&
                      (bVar15 = ssl_add_message_cbb(pSVar40,(CBB *)&msg), bVar15)))) {
                    if (((pSVar40->s3->field_0xdc & 0x20) == 0) &&
                       ((this_03->_M_t).
                        super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>.
                        _M_t.
                        super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>
                        .super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl ==
                        (Verifier *)0x0)) {
                      bVar15 = tls13_add_certificate(hs);
                      if (!bVar15) goto LAB_0023c355;
                      hs->tls13_state = 5;
                    }
                    else {
                      hs->tls13_state = 6;
                    }
                    sVar37 = ssl_hs_ok;
                  }
                }
              }
            }
          }
        }
      }
LAB_0023c355:
      internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&msg);
      Array<unsigned_char>::~Array(&server_hello);
      break;
    case 5:
      sVar23 = tls13_add_certificate_verify(hs);
      iVar21 = 6;
      sVar37 = ssl_hs_ok;
      if (sVar23 != ssl_private_key_success) {
        sVar37 = ssl_hs_error;
        if (sVar23 == ssl_private_key_failure) break;
        if (sVar23 != ssl_private_key_retry) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,0x41c,
                        "enum ssl_hs_wait_t bssl::do_send_server_certificate_verify(SSL_HANDSHAKE *)"
                       );
        }
        iVar21 = 5;
        sVar37 = ssl_hs_private_key_operation;
      }
      hs->tls13_state = iVar21;
      break;
    case 6:
      sVar37 = ssl_hs_hints_ready;
      if ((*(uint *)&hs->field_0x6c8 >> 0x14 & 1) == 0) {
        pSVar40 = hs->ssl;
        *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 | 0x800000;
        bVar15 = tls13_add_finished(hs);
        sVar37 = ssl_hs_error;
        if (bVar15) {
          puVar27 = (uchar *)SSLTranscript::DigestLen(this_01);
          in_07.size_ = (size_t)puVar34;
          in_07.data_ = puVar27;
          bVar15 = tls13_advance_key_schedule((bssl *)hs,(SSL_HANDSHAKE *)kZeroes,in_07);
          sVar37 = ssl_hs_error;
          if (bVar15) {
            bVar15 = tls13_derive_application_secrets(hs);
            sVar37 = ssl_hs_error;
            if (bVar15) {
              in_R9 = (SSL_CLIENT_HELLO *)(ulong)(hs->server_traffic_secret_0).size_;
              traffic_secret_01.size_ = (size_t)in_stack_fffffffffffffce0;
              traffic_secret_01.data_ = (uchar *)contents;
              bVar15 = tls13_set_traffic_key
                                 ((bssl *)pSVar40,(SSL *)0x3,ssl_encryption_early_data,
                                  (evp_aead_direction_t)
                                  (hs->new_session)._M_t.
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                                  (SSL_SESSION *)&hs->server_traffic_secret_0,traffic_secret_01);
              sVar37 = ssl_hs_error;
              if (bVar15) {
                hs->tls13_state = 7;
                sVar37 = ssl_hs_handback;
                if ((hs->field_0x6ca & 8) == 0) {
                  sVar37 = ssl_hs_ok;
                }
              }
            }
          }
        }
      }
      break;
    case 7:
      if ((hs->ssl->s3->field_0xdd & 2) == 0) {
LAB_0023a627:
        hs->tls13_state = 8;
LAB_0023a62e:
        sVar37 = ssl_hs_flush;
      }
      else {
        iVar21 = SSL_is_quic(hs->ssl);
        if ((iVar21 != 0) ||
           (in_03.size_ = 4, in_03.data_ = "\x05", bVar15 = SSLTranscript::Update(this_01,in_03),
           bVar15)) {
          sVar25 = SSLTranscript::DigestLen(this_01);
          InplaceVector<unsigned_char,_64UL>::Resize(this_02,sVar25);
          bVar15 = tls13_finished_mac(hs,(uint8_t *)this_02,(size_t *)&client_hello,false);
          if (bVar15) {
            if (client_hello.ssl == (SSL *)(ulong)(hs->expected_client_finished).size_) {
              iVar21 = SSL_is_dtls(hs->ssl);
              if (iVar21 != 0) {
                __assert_fail("!SSL_is_dtls(hs->ssl)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                              ,0x456,
                              "enum ssl_hs_wait_t bssl::do_send_half_rtt_ticket(SSL_HANDSHAKE *)");
              }
              msg._3_1_ = (hs->expected_client_finished).size_;
              msg.is_v2_hello = true;
              msg.type = '\0';
              msg._2_1_ = 0;
              in_04.size_ = 4;
              in_04.data_ = &msg.is_v2_hello;
              bVar15 = SSLTranscript::Update(this_01,in_04);
              if (((bVar15) &&
                  (in_05.size_._0_1_ = (hs->expected_client_finished).size_,
                  in_05.data_ = (uchar *)this_02, in_05.size_._1_7_ = 0,
                  bVar15 = SSLTranscript::Update(this_01,in_05), bVar15)) &&
                 (bVar15 = tls13_derive_resumption_secret(hs), bVar15)) {
                bVar15 = add_new_session_tickets(hs,(bool *)&creds);
                sVar37 = ssl_hs_error;
                if (bVar15) goto LAB_0023a627;
                break;
              }
            }
            else {
              ERR_put_error(0x10,0,0x44,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                            ,0x44d);
            }
          }
LAB_0023b544:
          sVar37 = ssl_hs_error;
        }
        else {
          iVar21 = 0x44;
          iVar41 = 0x441;
LAB_0023b1f3:
          ERR_put_error(0x10,0,iVar21,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,iVar41);
          sVar37 = ssl_hs_error;
        }
      }
      break;
    case 8:
      pSVar40 = hs->ssl;
      if ((pSVar40->s3->field_0xdd & 2) != 0) {
        in_R9 = (SSL_CLIENT_HELLO *)(ulong)(hs->early_traffic_secret).size_;
        traffic_secret_02.size_ = (size_t)in_stack_fffffffffffffce0;
        traffic_secret_02.data_ = (uchar *)contents;
        bVar15 = tls13_set_traffic_key
                           ((bssl *)pSVar40,(SSL *)0x1,ssl_encryption_initial,
                            (evp_aead_direction_t)
                            (hs->new_session)._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                            (SSL_SESSION *)&hs->early_traffic_secret,traffic_secret_02);
        sVar37 = ssl_hs_error;
        if (!bVar15) break;
        hs->field_0x6c9 = hs->field_0x6c9 | 0x34;
      }
      bVar15 = uses_end_of_early_data(pSVar40);
      sVar33 = ssl_hs_read_end_of_early_data;
      if (!bVar15) {
        in_R9 = (SSL_CLIENT_HELLO *)(ulong)(hs->client_handshake_secret).size_;
        traffic_secret_03.size_ = (size_t)in_stack_fffffffffffffce0;
        traffic_secret_03.data_ = (uchar *)contents;
        bVar15 = tls13_set_traffic_key
                           ((bssl *)pSVar40,(SSL *)0x2,ssl_encryption_initial,
                            (evp_aead_direction_t)
                            (hs->new_session)._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                            (SSL_SESSION *)&hs->client_handshake_secret,traffic_secret_03);
        sVar33 = ssl_hs_early_return;
        sVar37 = ssl_hs_error;
        if (!bVar15) break;
      }
      hs->tls13_state = 9;
      sVar37 = sVar33;
      if ((pSVar40->s3->field_0xdd & 2) == 0) {
        sVar37 = ssl_hs_ok;
      }
      break;
    case 9:
      pSVar40 = hs->ssl;
      bVar15 = uses_end_of_early_data(pSVar40);
      if (bVar15) {
        if ((hs->ssl->s3->field_0xdd & 2) == 0) {
LAB_00239f42:
          in_R9 = (SSL_CLIENT_HELLO *)(ulong)(hs->client_handshake_secret).size_;
          traffic_secret_00.size_ = (size_t)in_stack_fffffffffffffce0;
          traffic_secret_00.data_ = (uchar *)contents;
          bVar15 = tls13_set_traffic_key
                             ((bssl *)pSVar40,(SSL *)0x2,ssl_encryption_initial,
                              (evp_aead_direction_t)
                              (hs->new_session)._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                              (SSL_SESSION *)&hs->client_handshake_secret,traffic_secret_00);
          sVar37 = ssl_hs_error;
          if (bVar15) goto LAB_00239f70;
        }
        else {
          bVar15 = (*pSVar40->method->get_message)(pSVar40,(SSLMessage *)&client_hello);
          sVar37 = ssl_hs_read_message;
          if (bVar15) {
            bVar15 = ssl_check_message_type(pSVar40,(SSLMessage *)&client_hello,5);
            sVar37 = ssl_hs_error;
            if (bVar15) {
              if (client_hello.client_hello_len != 0) {
                ssl_send_alert(pSVar40,2,0x32);
                iVar21 = 0x89;
                iVar41 = 0x49d;
                goto LAB_0023b1f3;
              }
              (*pSVar40->method->next_message)(pSVar40);
              goto LAB_00239f42;
            }
          }
        }
      }
      else {
LAB_00239f70:
        hs->tls13_state = 10;
LAB_0023aad0:
        sVar37 = ssl_hs_ok;
      }
      break;
    case 10:
      if (((((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->field_0x1b8 & 0x40) == 0)
         || (pSVar40 = hs->ssl, (pSVar40->s3->field_0xdd & 2) != 0)) {
LAB_0023aa19:
        hs->tls13_state = 0xb;
        goto LAB_0023aad0;
      }
      bVar15 = (*pSVar40->method->get_message)(pSVar40,(SSLMessage *)&client_hello);
      sVar37 = ssl_hs_read_message;
      if (bVar15) {
        bVar15 = ssl_check_message_type(pSVar40,(SSLMessage *)&client_hello,8);
        sVar37 = ssl_hs_error;
        if (bVar15) {
          creds.data_ = (ssl_credential_st **)client_hello.client_hello;
          creds.size_ = client_hello.client_hello_len;
          iVar21 = CBS_get_u16_length_prefixed((CBS *)&creds,(CBS *)&extensions);
          if ((iVar21 != 0) && (creds.size_ == 0)) {
            uVar18 = 0x44cd;
            if ((*(ushort *)&hs->config->field_0x10d >> 0xd & 1) == 0) {
              uVar18 = 0x4469;
            }
            msg._2_2_ = 1;
            msg.is_v2_hello = (bool)(char)uVar18;
            msg.type = (char)((ushort)uVar18 >> 8);
            msg.body.data = (uint8_t *)0x0;
            msg.body.len = 0;
            sigalg_contents.child = (CBB *)CONCAT71(sigalg_contents.child._1_7_,0x32);
            sigalg = (uint16_t)&msg;
            uStack_1d6 = (undefined6)((ulong)&msg >> 0x10);
            bVar15 = ssl_parse_extensions
                               ((bssl *)&extensions,(CBS *)&sigalg_contents,(uint8_t *)&sigalg,
                                (initializer_list<bssl::SSLExtension_*>)ZEXT816(1),SUB81(in_R9,0));
            if (bVar15) {
              if (msg._3_1_ == '\0') {
                ERR_put_error(0x10,0,0xa4,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                              ,0x4d0);
                uVar24 = 0x6d;
              }
              else {
                in_01.size_ = msg.body.len;
                in_01.data_ = msg.body.data;
                bVar15 = Array<unsigned_char>::CopyFrom
                                   (&((this->_M_t).
                                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)
                                     ->peer_application_settings,in_01);
                uVar24 = 0x50;
                if (bVar15) {
                  bVar15 = ssl_hash_message(hs,(SSLMessage *)&client_hello);
                  uVar24 = 0x50;
                  if (bVar15) {
                    (*pSVar40->method->next_message)(pSVar40);
                    goto LAB_0023aa19;
                  }
                }
              }
            }
            else {
              uVar24 = (uint)(byte)sigalg_contents.child;
            }
            ssl_send_alert(pSVar40,2,uVar24);
            goto LAB_0023b544;
          }
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,0x4be);
          iVar21 = 0x32;
          goto LAB_00239d20;
        }
      }
      break;
    case 0xb:
      pSVar40 = hs->ssl;
      if ((hs->field_0x6c8 & 0x20) == 0) {
        if ((pSVar40->s3->field_0xdc & 0x20) == 0) {
          ((this->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->verify_result = 0;
        }
LAB_0023aac9:
        hs->tls13_state = 0xd;
        goto LAB_0023aad0;
      }
      bVar43 = hs->config->verify_mode;
      bVar15 = (*pSVar40->method->get_message)(pSVar40,(SSLMessage *)&client_hello);
      sVar37 = ssl_hs_read_message;
      if (bVar15) {
        bVar15 = ssl_check_message_type(pSVar40,(SSLMessage *)&client_hello,0xb);
        sVar37 = ssl_hs_error;
        if (((bVar15) &&
            (bVar15 = tls13_process_certificate(hs,(SSLMessage *)&client_hello,(bVar43 & 2) == 0),
            bVar15)) && (bVar15 = ssl_hash_message(hs,(SSLMessage *)&client_hello), bVar15)) {
          (*pSVar40->method->next_message)(pSVar40);
          hs->tls13_state = 0xc;
          goto LAB_0023aad0;
        }
      }
      break;
    case 0xc:
      pSVar40 = hs->ssl;
      sVar25 = OPENSSL_sk_num((OPENSSL_STACK *)
                              (((hs->new_session)._M_t.
                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->certs)
                              ._M_t.
                              super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                             );
      if (sVar25 == 0) goto LAB_0023aac9;
      bVar15 = (*pSVar40->method->get_message)(pSVar40,(SSLMessage *)&client_hello);
      sVar37 = ssl_hs_read_message;
      if (bVar15) {
        sVar20 = ssl_verify_peer_cert(hs);
        sVar37 = ssl_hs_error;
        if (sVar20 != ssl_verify_invalid) {
          iVar21 = 0xc;
          sStackY_330 = ssl_hs_certificate_verify;
          if (sVar20 != ssl_verify_retry) {
            bVar15 = ssl_check_message_type(pSVar40,(SSLMessage *)&client_hello,0xf);
            if (((!bVar15) ||
                (bVar15 = tls13_process_certificate_verify(hs,(SSLMessage *)&client_hello), !bVar15)
                ) || (bVar15 = ssl_hash_message(hs,(SSLMessage *)&client_hello), !bVar15)) break;
            (*pSVar40->method->next_message)(pSVar40);
            iVar21 = 0xd;
            sStackY_330 = ssl_hs_ok;
          }
          hs->tls13_state = iVar21;
          sVar37 = sStackY_330;
        }
      }
      break;
    case 0xd:
      if ((hs->field_0x6cb & 1) == 0) {
LAB_0023a7df:
        hs->tls13_state = 0xe;
        goto LAB_0023aad0;
      }
      pSVar40 = hs->ssl;
      bVar15 = (*pSVar40->method->get_message)(pSVar40,(SSLMessage *)&client_hello);
      sVar37 = ssl_hs_read_message;
      if (bVar15) {
        bVar15 = ssl_check_message_type(pSVar40,(SSLMessage *)&client_hello,0xcb);
        sVar37 = ssl_hs_error;
        if (((bVar15) && (bVar15 = tls1_verify_channel_id(hs,(SSLMessage *)&client_hello), bVar15))
           && (bVar15 = ssl_hash_message(hs,(SSLMessage *)&client_hello), bVar15)) {
          (*pSVar40->method->next_message)(pSVar40);
          goto LAB_0023a7df;
        }
      }
      break;
    case 0xe:
      pSVar40 = hs->ssl;
      bVar15 = (*pSVar40->method->get_message)(pSVar40,(SSLMessage *)&client_hello);
      sVar37 = ssl_hs_read_message;
      if (bVar15) {
        bVar15 = ssl_check_message_type(pSVar40,(SSLMessage *)&client_hello,0x14);
        sVar37 = ssl_hs_error;
        if ((bVar15) &&
           (bVar15 = tls13_process_finished
                               (hs,(SSLMessage *)&client_hello,
                                (bool)((byte)((ushort)*(undefined2 *)&pSVar40->s3->field_0xdc >> 9)
                                      & 1)), bVar15)) {
          in_R9 = (SSL_CLIENT_HELLO *)(ulong)(hs->client_traffic_secret_0).size_;
          sVar37 = ssl_hs_error;
          traffic_secret.size_ = (size_t)in_stack_fffffffffffffce0;
          traffic_secret.data_ = (uchar *)contents;
          bVar15 = tls13_set_traffic_key
                             ((bssl *)pSVar40,(SSL *)0x3,ssl_encryption_initial,
                              (evp_aead_direction_t)
                              (hs->new_session)._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                              (SSL_SESSION *)&hs->client_traffic_secret_0,traffic_secret);
          if (bVar15) {
            iVar21 = 0x10;
            if ((pSVar40->s3->field_0xdd & 2) == 0) {
              bVar15 = ssl_hash_message(hs,(SSLMessage *)&client_hello);
              if (bVar15) {
                bVar15 = tls13_derive_resumption_secret(hs);
                iVar21 = 0xf;
                if (bVar15) goto LAB_00239de5;
              }
            }
            else {
LAB_00239de5:
              hs->tls13_state = iVar21;
              psVar4 = (hs->credential)._M_t.
                       super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl;
              if ((psVar4 != (ssl_credential_st *)0x0) && (psVar4->type == kSPAKE2PlusV1Server)) {
                ssl_credential_st::RestorePAKEAttempt(psVar4);
              }
              (*pSVar40->method->next_message)(pSVar40);
              iVar21 = SSL_is_dtls(pSVar40);
              sVar37 = ssl_hs_ok;
              if (iVar21 != 0) {
                (*pSVar40->method->schedule_ack)(pSVar40);
                goto LAB_0023a62e;
              }
            }
          }
        }
      }
      break;
    case 0xf:
      pSVar40 = hs->ssl;
      bVar15 = add_new_session_tickets(hs,(bool *)&client_hello);
      sVar37 = ssl_hs_error;
      if (bVar15) {
        hs->tls13_state = 0x10;
        sVar37 = ssl_hs_ok;
        if ((char)client_hello.ssl == '\x01') {
          iVar21 = SSL_is_dtls(pSVar40);
          sVar37 = ssl_hs_flush;
          if (iVar21 == 0) {
            iVar21 = SSL_is_quic(pSVar40);
            sVar37 = (uint)(iVar21 != 0) * 3 + ssl_hs_ok;
          }
        }
      }
      break;
    case 0x10:
      return ssl_hs_ok;
    }
    if (hs->tls13_state != iVar2) {
      ssl_do_info_callback(hs->ssl,0x2001,1);
    }
    if (sVar37 != ssl_hs_ok) {
      return sVar37;
    }
  } while( true );
}

Assistant:

enum ssl_hs_wait_t tls13_server_handshake(SSL_HANDSHAKE *hs) {
  while (hs->tls13_state != state13_done) {
    enum ssl_hs_wait_t ret = ssl_hs_error;
    enum tls13_server_hs_state_t state =
        static_cast<enum tls13_server_hs_state_t>(hs->tls13_state);
    switch (state) {
      case state13_select_parameters:
        ret = do_select_parameters(hs);
        break;
      case state13_select_session:
        ret = do_select_session(hs);
        break;
      case state13_send_hello_retry_request:
        ret = do_send_hello_retry_request(hs);
        break;
      case state13_read_second_client_hello:
        ret = do_read_second_client_hello(hs);
        break;
      case state13_send_server_hello:
        ret = do_send_server_hello(hs);
        break;
      case state13_send_server_certificate_verify:
        ret = do_send_server_certificate_verify(hs);
        break;
      case state13_send_server_finished:
        ret = do_send_server_finished(hs);
        break;
      case state13_send_half_rtt_ticket:
        ret = do_send_half_rtt_ticket(hs);
        break;
      case state13_read_second_client_flight:
        ret = do_read_second_client_flight(hs);
        break;
      case state13_process_end_of_early_data:
        ret = do_process_end_of_early_data(hs);
        break;
      case state13_read_client_encrypted_extensions:
        ret = do_read_client_encrypted_extensions(hs);
        break;
      case state13_read_client_certificate:
        ret = do_read_client_certificate(hs);
        break;
      case state13_read_client_certificate_verify:
        ret = do_read_client_certificate_verify(hs);
        break;
      case state13_read_channel_id:
        ret = do_read_channel_id(hs);
        break;
      case state13_read_client_finished:
        ret = do_read_client_finished(hs);
        break;
      case state13_send_new_session_ticket:
        ret = do_send_new_session_ticket(hs);
        break;
      case state13_done:
        ret = ssl_hs_ok;
        break;
    }

    if (hs->tls13_state != state) {
      ssl_do_info_callback(hs->ssl, SSL_CB_ACCEPT_LOOP, 1);
    }

    if (ret != ssl_hs_ok) {
      return ret;
    }
  }

  return ssl_hs_ok;
}